

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

Vector3D * __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::
StartVectorOfStructs<Geometry::Vector3D,flatbuffers::Offset>
          (FlatBufferBuilderImpl<false> *this,size_t vector_size)

{
  uint8_t **ppuVar1;
  uint *puVar2;
  size_t len;
  
  StartVector<flatbuffers::Offset,unsigned_int>(this,vector_size,0xc,4);
  len = vector_size * 0xc;
  if (len != 0) {
    vector_downward<unsigned_int>::ensure_space(&this->buf_,len);
    ppuVar1 = &(this->buf_).cur_;
    *ppuVar1 = *ppuVar1 + vector_size * -0xc;
    puVar2 = &(this->buf_).size_;
    *puVar2 = *puVar2 + (int)len;
  }
  return (Vector3D *)(this->buf_).cur_;
}

Assistant:

T *StartVectorOfStructs(size_t vector_size) {
    StartVector<OffsetT>(vector_size, sizeof(T), AlignOf<T>());
    return reinterpret_cast<T *>(buf_.make_space(vector_size * sizeof(T)));
  }